

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_make_histde(fitsfile *fptr,fitsfile *histptr,int *datatypes,int bitpix,int naxis,
                    long *naxes,int *colnum,char **colexpr,double *amin,double *amax,double *binsize
                    ,double weight,int wtcolnum,char *wtexpr,int recip,char *selectrow,int *status)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  int local_b90;
  int local_b8c;
  int wtdatatype_1;
  int jj_1;
  long wtnaxes [5];
  int local_b54;
  int local_b50;
  int wtnaxis;
  int wtdatatype;
  int jj;
  long naxes_1 [5];
  long local_b18;
  long nelem;
  int local_b08;
  int naxis1;
  int datatype_1;
  int datatype;
  long colrepeat;
  long wtrepeat;
  long repeat;
  double double_nulval;
  iteratorCol *iterCols;
  int local_ad0;
  int numIterCols;
  int startCol;
  int numAllocCols;
  parseInfo infos [5];
  ParseData parsers [5];
  long nrows;
  iteratorCol imagepars [1];
  histType histData;
  double maxbin [4];
  double tbin [4];
  double tmax [4];
  double tmin [4];
  double taxes [4];
  long n_per_loop;
  long offset;
  long ibin;
  long imax;
  long imin;
  int local_50;
  int n_cols;
  int imagetype;
  int ii;
  double weight_local;
  long *naxes_local;
  int naxis_local;
  int bitpix_local;
  int *datatypes_local;
  fitsfile *histptr_local;
  fitsfile *fptr_local;
  
  parsers[4].status = -1;
  parsers[4]._228_4_ = 0xffffffff;
  numIterCols = 0;
  local_ad0 = -1;
  iterCols._4_4_ = 0;
  double_nulval = 0.0;
  repeat = -0x4757c1d7a1454b49;
  wtrepeat = 0;
  colrepeat = 0;
  if (0 < *status) {
    return *status;
  }
  memset(&startCol,0,0x2d0);
  memset(infos[4].parseVariables.zeros + 3,0,0x488);
  memset(imagepars[0].tdisp + 0x42,0,0x130);
  if (4 < naxis) {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
    return 0x140;
  }
  if (bitpix == 8) {
    local_50 = 0xb;
  }
  else if (bitpix == 0x10) {
    local_50 = 0x15;
  }
  else if (bitpix == 0x20) {
    local_50 = 0x1f;
  }
  else if (bitpix == -0x20) {
    local_50 = 0x2a;
  }
  else {
    if (bitpix != -0x40) {
      *status = 0x19a;
      return 0x19a;
    }
    local_50 = 0x52;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  _imagetype = (char *)weight;
  if ((((0 < wtcolnum) || ((wtexpr != (char *)0x0 && (*wtexpr != '\0')))) && (weight == 0.0)) &&
     (!NAN(weight))) {
    _imagetype = (char *)0xb8a83e285ebab4b7;
  }
  histData.wtexpr = _imagetype;
  histData.incr[4]._4_4_ = wtcolnum;
  histData._208_8_ = wtexpr;
  histData.incr[4]._0_4_ = recip;
  histData.hcolnum[2] = local_50;
  histData.weight = (double)selectrow;
  numIterCols = 5;
  histData.hist = (anon_union_8_5_814d2bcf_for_hist)fptr;
  histData.tblptr._0_4_ = naxis;
  double_nulval = (double)fits_recalloc((void *)0x0,0,5,0x110);
  if ((void *)double_nulval == (void *)0x0) {
    ffpmsg("memory allocation failure (fits_make_histde)");
    *status = 0x71;
    goto LAB_0021eb34;
  }
  for (n_cols = 0; n_cols < 5; n_cols = n_cols + 1) {
    histData.startCols[(long)n_cols + -2] = -1;
  }
  local_ad0 = 0;
  for (n_cols = 0; n_cols < naxis; n_cols = n_cols + 1) {
    _datatype_1 = 0;
    histData.startCols[(long)n_cols + -2] = local_ad0;
    tmin[(long)n_cols + 3] = (double)naxes[n_cols];
    tmax[(long)n_cols + 3] = amin[n_cols];
    tbin[(long)n_cols + 3] = amax[n_cols];
    if (((amax[n_cols] <= amin[n_cols] && amin[n_cols] != amax[n_cols]) && (0.0 < binsize[n_cols]))
       || ((amin[n_cols] < amax[n_cols] && (binsize[n_cols] <= 0.0 && binsize[n_cols] != 0.0)))) {
      maxbin[(long)n_cols + 3] = -binsize[n_cols];
    }
    else {
      maxbin[(long)n_cols + 3] = binsize[n_cols];
    }
    dVar1 = tmax[(long)n_cols + 3];
    dVar2 = tbin[(long)n_cols + 3];
    dVar3 = maxbin[(long)n_cols + 3];
    if (((colexpr == (char **)0x0) || (colexpr[n_cols] == (char *)0x0)) ||
       (*colexpr[n_cols] == '\0')) {
      ffeqty(fptr,colnum[n_cols],&naxis1,(long *)&datatype_1,(long *)0x0,status);
    }
    if ((datatypes != (int *)0x0) && (datatypes[n_cols] != 0)) {
      naxis1 = datatypes[n_cols];
    }
    if ((((0x29 < naxis1) || ((double)(long)dVar1 != tmax[(long)n_cols + 3])) ||
        ((NAN((double)(long)dVar1) || NAN(tmax[(long)n_cols + 3]) ||
         ((((double)(long)dVar2 != tbin[(long)n_cols + 3] ||
           (NAN((double)(long)dVar2) || NAN(tbin[(long)n_cols + 3]))) ||
          ((double)(long)dVar3 != maxbin[(long)n_cols + 3])))))) ||
       (NAN((double)(long)dVar3) || NAN(maxbin[(long)n_cols + 3]))) {
      maxbin[(long)n_cols + -1] =
           (tbin[(long)n_cols + 3] - tmax[(long)n_cols + 3]) / maxbin[(long)n_cols + 3];
    }
    else {
      maxbin[(long)n_cols + -1] = tmin[(long)n_cols + 3] + 1.0;
      if (tbin[(long)n_cols + 3] <= tmax[(long)n_cols + 3]) {
        tmax[(long)n_cols + 3] = tmax[(long)n_cols + 3] + 0.5;
        tbin[(long)n_cols + 3] = tbin[(long)n_cols + 3] - 0.5;
      }
      else {
        tmax[(long)n_cols + 3] = tmax[(long)n_cols + 3] - 0.5;
        tbin[(long)n_cols + 3] = tbin[(long)n_cols + 3] + 0.5;
      }
    }
    if (((colexpr == (char **)0x0) || (colexpr[n_cols] == (char *)0x0)) ||
       (*colexpr[n_cols] == '\0')) {
      fits_iter_set_by_num
                ((iteratorCol *)((long)double_nulval + (long)local_ad0 * 0x110),fptr,colnum[n_cols],
                 0x52,0);
      local_ad0 = local_ad0 + 1;
    }
    else {
      ffiprs(fptr,0,colexpr[n_cols],5,&local_b08,&local_b18,(int *)((long)&nelem + 4),
             (long *)&wtdatatype,(ParseData *)&parsers[(long)n_cols + -1].status,status);
      if (*status != 0) goto LAB_0021eb34;
      if (local_b18 < 0) {
        local_b18 = 1;
      }
      _datatype_1 = local_b18;
      ffgnrw(fptr,(long *)&parsers[4].status,status);
      iVar4 = fits_parser_set_temporary_col
                        ((ParseData *)&parsers[(long)n_cols + -1].status,
                         (parseInfo *)(&startCol + (long)n_cols * 0x24),parsers[4]._224_8_,&repeat,
                         status);
      if (iVar4 != 0) goto LAB_0021eb34;
      double_nulval =
           (double)fits_recalloc((void *)double_nulval,(long)numIterCols,
                                 (long)(numIterCols + (int)parsers[n_cols].nRows),0x110);
      if ((void *)double_nulval == (void *)0x0) {
        *status = 0x71;
        goto LAB_0021eb34;
      }
      numIterCols = (int)parsers[n_cols].nRows + numIterCols;
      for (wtnaxis = 0; wtnaxis < (int)parsers[n_cols].nRows; wtnaxis = wtnaxis + 1) {
        lVar5 = (long)local_ad0;
        local_ad0 = local_ad0 + 1;
        memcpy((void *)((long)double_nulval + lVar5 * 0x110),
               (void *)(parsers[n_cols].nAxes[4] + (long)wtnaxis * 0x110),0x110);
      }
    }
    if (wtrepeat == 0) {
      wtrepeat = _datatype_1;
    }
    else if (wtrepeat != _datatype_1) {
      ffpmsg("vector dimensions of binning values do not agree");
      *status = 0x140;
      goto LAB_0021eb34;
    }
  }
  if (((wtexpr == (char *)0x0) || (*wtexpr == '\0')) ||
     (((double)_imagetype != -9.1191291391491e-36 || (NAN((double)_imagetype))))) {
    if (((double)_imagetype != -9.1191291391491e-36) || (NAN((double)_imagetype))) {
      colrepeat = wtrepeat;
    }
    else {
      ffeqty(fptr,wtcolnum,&local_b90,&colrepeat,(long *)0x0,status);
      histData.startCols[2] = local_ad0;
      fits_iter_set_by_num
                ((iteratorCol *)((long)double_nulval + (long)local_ad0 * 0x110),fptr,wtcolnum,0x52,0
                );
      local_ad0 = local_ad0 + 1;
    }
  }
  else {
    histData.startCols[2] = local_ad0;
    ffiprs(fptr,0,wtexpr,5,&local_b50,&colrepeat,&local_b54,(long *)&wtdatatype_1,
           (ParseData *)&parsers[3].status,status);
    if (*status != 0) goto LAB_0021eb34;
    if (colrepeat < 0) {
      colrepeat = 1;
    }
    ffgnrw(fptr,(long *)&parsers[4].status,status);
    iVar4 = fits_parser_set_temporary_col
                      ((ParseData *)&parsers[3].status,
                       (parseInfo *)(infos[3].parseVariables.zeros + 3),parsers[4]._224_8_,&repeat,
                       status);
    if (iVar4 != 0) goto LAB_0021eb34;
    double_nulval =
         (double)fits_recalloc((void *)double_nulval,(long)numIterCols,
                               (long)(numIterCols + (int)parsers[4].nRows),0x110);
    if ((void *)double_nulval == (void *)0x0) {
      *status = 0x71;
      goto LAB_0021eb34;
    }
    numIterCols = (int)parsers[n_cols].nRows + numIterCols;
    for (local_b8c = 0; local_b8c < (int)parsers[4].nRows; local_b8c = local_b8c + 1) {
      lVar5 = (long)local_ad0;
      local_ad0 = local_ad0 + 1;
      memcpy((void *)((long)double_nulval + lVar5 * 0x110),
             (void *)(parsers[4].nAxes[4] + (long)local_b8c * 0x110),0x110);
    }
  }
  if (((colrepeat == 0) || (wtrepeat == 0)) || (colrepeat == wtrepeat)) {
    iterCols._4_4_ = local_ad0;
    histData.startCols[3] = local_ad0;
    histData._272_8_ = double_nulval;
    histData.iterCols = (iteratorCol *)(infos[4].parseVariables.zeros + 3);
    histData.parsers = (ParseData *)&startCol;
    histData.rowselector_cur = (char *)wtrepeat;
    histData.tblptr._4_4_ = *colnum;
    histData.haxis4 = (long)tmax[3];
    histData.amin4 = (double)histData.infos;
    histData.maxbin4 = maxbin[3];
    histData._32_8_ = (BADTYPE)tmin[3];
    histData.binsize4 = 4.94065645841247e-324;
    if (1 < (int)histData.tblptr) {
      histData.haxis = colnum[1];
      histData.amin1 = tmin[0];
      histData.maxbin1 = maxbin[0];
      histData.binsize1 = tbin[0];
      histData.haxis1 = (long)taxes[0];
      histData.incr[0] = histData._32_8_;
      if (2 < (int)histData.tblptr) {
        histData.hcolnum[0] = colnum[2];
        histData.amin2 = tmin[1];
        histData.maxbin2 = maxbin[1];
        histData.binsize2 = tbin[1];
        histData.haxis2 = (long)taxes[1];
        histData.incr[1] = histData._32_8_ * histData.haxis1;
        if (3 < (int)histData.tblptr) {
          histData.hcolnum[1] = colnum[3];
          histData.amin3 = tmin[2];
          histData.maxbin3 = maxbin[2];
          histData.binsize3 = tbin[2];
          histData.haxis3 = (long)taxes[2];
          histData.incr[2] = histData.incr[1] * histData.haxis2;
        }
      }
    }
    fits_iter_set_file((iteratorCol *)&nrows,histptr);
    fits_iter_set_datatype((iteratorCol *)&nrows,local_50);
    fits_iter_set_iotype((iteratorCol *)&nrows,2);
    ffiter(1,(iteratorCol *)&nrows,0,-1,ffwritehisto,imagepars[0].tdisp + 0x42,status);
  }
  else {
    ffpmsg("vector dimensions of weights do not agree with bins");
    *status = 0x140;
  }
LAB_0021eb34:
  if (double_nulval != 0.0) {
    free((void *)double_nulval);
  }
  for (n_cols = 0; n_cols < 5; n_cols = n_cols + 1) {
    if (0 < (int)parsers[n_cols].nRows) {
      ffcprs((ParseData *)&parsers[(long)n_cols + -1].status);
    }
  }
  return *status;
}

Assistant:

int fits_make_histde(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int *datatypes,   /*  I - datatype of input (or 0 for auto) */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,      /* I - column numbers (array length = naxis)   */
    char *colexpr[4], /* I - optional expression instead of column */
    double *amin,     /* I - minimum histogram value, for each axis */
    double *amax,     /* I - maximum histogram value, for each axis */
    double *binsize,  /* I - bin size along each axis               */
    double weight,    /* I - binning weighting factor (0 or DOUBLENULLVALUE means null) */
    int wtcolnum,     /* I - optional keyword or col for weight*/
    char *wtexpr,     /* I - optional weighting expression */
		      /*  disambiguation of weight values */
		      /*    non-null weight: use that value */
		      /*    null weight: use wtexpr if non-null, else wtcolnum */
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
    int ii, imagetype;
    int n_cols = 1;
    long imin, imax, ibin;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    double taxes[4], tmin[4], tmax[4], tbin[4], maxbin[4];
    histType histData;    /* Structure holding histogram info for iterator */
    iteratorCol imagepars[1];
    long nrows = -1;
    ParseData parsers[5];
    parseInfo infos[5];
    int numAllocCols = 0, startCol = -1, numIterCols = 0;
    iteratorCol *iterCols = 0;
    double double_nulval = DOUBLENULLVALUE;
    long repeat = 0, wtrepeat = 0;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Make sure the parser information is initialized because we will
       use this to determine what needs to be deallocated at the end */
    memset(infos, 0, sizeof(infos));
    memset(parsers, 0, sizeof(parsers));
    memset(&histData, 0, sizeof(histData));

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    if   (bitpix == BYTE_IMG)
         imagetype = TBYTE;
    else if (bitpix == SHORT_IMG)
         imagetype = TSHORT;
    else if (bitpix == LONG_IMG)
         imagetype = TINT;    
    else if (bitpix == FLOAT_IMG)
         imagetype = TFLOAT;    
    else if (bitpix == DOUBLE_IMG)
         imagetype = TDOUBLE;    
    else
        return(*status = BAD_DATATYPE);

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    /* Resolve the conflict between wtexpr, wtcolnum, and weight */
    if ( ((wtcolnum > 0) || (wtexpr && wtexpr[0])) && weight == 0 ) weight = DOUBLENULLVALUE;
    histData.weight     = weight;
    histData.wtcolnum   = wtcolnum;
    histData.wtexpr     = wtexpr;
    histData.wtrecip    = recip;
    histData.tblptr     = fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    /* Now make iterator columns for input, as well as any calculated values */
    numAllocCols = 5;
    iterCols = fits_recalloc(0, 0, numAllocCols, sizeof(iteratorCol));
    if (!iterCols) {
      ffpmsg("memory allocation failure (fits_make_histde)");
      *status = MEMORY_ALLOCATION;
      goto cleanup;
    }

    /* We fill the iterCols in order, starting from column 1 through 4, and 
       then moving on to the weighting column */
    for (ii = 0; ii < 5; ii++)  histData.startCols[ii] = -1;
    startCol = 0;

    /* Loop through each axis and recheck the binning parameters */
    for (ii = 0; ii < naxis; ii++)
    {
      long colrepeat = 0;
      int datatype;
      histData.startCols[ii] = startCol;

      taxes[ii] = (double) naxes[ii];
      tmin[ii] = amin[ii];
      tmax[ii] = amax[ii];
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          tbin[ii] =  -binsize[ii];  /* reverse the sign of binsize */
      else
          tbin[ii] =   binsize[ii];  /* binsize has the correct sign */
          
      imin = (long) tmin[ii];
      imax = (long) tmax[ii];
      ibin = (long) tbin[ii];
    
      /* get the datatype of the column and repeat */
      if (! (colexpr && colexpr[ii] && colexpr[ii][0]) ) {
	fits_get_eqcoltype(fptr, colnum[ii], &datatype, &colrepeat, NULL, status);
      }

      /* If caller specified datatype, use that */
      if (datatypes && datatypes[ii]) {
	datatype = datatypes[ii];
      }

      if (datatype <= TLONG && (double) imin == tmin[ii] &&
                               (double) imax == tmax[ii] &&
                               (double) ibin == tbin[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        maxbin[ii] = (taxes[ii] + 1.F);  /* add 1. instead of .5 to avoid roundoff */

        if (tmin[ii] < tmax[ii])
        {
          tmin[ii] = tmin[ii] - 0.5F;
          tmax[ii] = tmax[ii] + 0.5F;
        }
        else
        {
          tmin[ii] = tmin[ii] + 0.5F;
          tmax[ii] = tmax[ii] - 0.5F;
        }
      } else {  /* not an integer column with integer limits */
          maxbin[ii] = (tmax[ii] - tmin[ii]) / tbin[ii]; 
      }

      /* This is a column expression.  Here is where we allocate the 
	 parser for it during the actual evaluation. */
      if (colexpr && colexpr[ii] && colexpr[ii][0]) {
	int datatype, naxis1;
	long nelem, naxes[MAXDIMS];
	int jj;

	/* Initialize the parser for this binning expression */
	ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis1,
		naxes, &(parsers[ii]), status );
	if (*status) goto cleanup;
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	colrepeat = nelem;

	/* Set up the parser data for evaluation to a TemporaryCol */
	fits_get_num_rows(fptr, &nrows, status);
	if (fits_parser_set_temporary_col(&(parsers[ii]), &(infos[ii]), nrows,
					  (void *) &(double_nulval), status)) goto cleanup;

	/* Copy iterator columns from the parser to the master iterator columns */
	iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[ii].nCols,
			    sizeof(iteratorCol));
	if (!iterCols) {
	  *status = MEMORY_ALLOCATION;
	  goto cleanup;
	}
	numAllocCols += parsers[ii].nCols;
	for (jj = 0; jj < parsers[ii].nCols; jj++) iterCols[startCol++] = parsers[ii].colData[jj];

      } else {

	/* Just a "regular" column name, we already have enough allocated for these */
	fits_iter_set_by_num(&(iterCols[startCol]), fptr, colnum[ii], TDOUBLE, InputCol);
	startCol ++;
      }

      /* Check that all the vector dimensions agree */
      if (repeat == 0) {
	repeat = colrepeat;
      } else {
	if (repeat != colrepeat) {
	  ffpmsg("vector dimensions of binning values do not agree");
	  *status = BAD_DIMEN;
	  goto cleanup;
	}
      }

    } /* End of loop over columns */

    /* Now initialize the iterator column data for the weighting */
    if (wtexpr && wtexpr[0] && weight == DOUBLENULLVALUE) {
      int wtdatatype, wtnaxis;
      long wtnaxes[MAXDIMS];
      int jj;

      histData.startCols[4] = startCol;
      ffiprs( fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &wtrepeat, &wtnaxis,
	      wtnaxes, &(parsers[4]), status );
      if (*status) goto cleanup;
      if (wtrepeat < 0) wtrepeat = 1; /* If it's a constant expression */

      /* Set up the parser data for evaluation to a TemporaryCol */
      /* It's a weighting expression, set that up and ... */
      fits_get_num_rows(fptr, &nrows, status);
      if (fits_parser_set_temporary_col(&(parsers[4]), &(infos[4]), nrows,
					(void *) &(double_nulval), status)) goto cleanup;

      /* Copy iterator columns from the parser to the master iterator columns */
      iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[4].nCols,
			  sizeof(iteratorCol));
      if (!iterCols) {
	*status = MEMORY_ALLOCATION;
	goto cleanup;
      }
      numAllocCols += parsers[ii].nCols;
      for (jj = 0; jj < parsers[4].nCols; jj++) iterCols[startCol++] = parsers[4].colData[jj];

    } else if (weight == DOUBLENULLVALUE) {
      int wtdatatype;

      /* It's a "regular" weighting column */
      fits_get_eqcoltype(fptr, wtcolnum, &wtdatatype, &wtrepeat, NULL, status);

      histData.startCols[4] = startCol;
      fits_iter_set_by_num(&(iterCols[startCol]), fptr, wtcolnum, TDOUBLE, InputCol);
      startCol ++;
    } else {

      /* In case of explicit numerical value, we can just use that number
	 in the vector expression, so the vector repeat of the weighting can
	 be set to that of the input */
      wtrepeat = repeat;
    }

    /* Vector dimension of weighting must agree with binning */
    if (wtrepeat != 0 && repeat != 0 && wtrepeat != repeat) {
      ffpmsg("vector dimensions of weights do not agree with bins");
      *status = BAD_DIMEN;
      goto cleanup;
    }

    /* We now know he number of iterator columns */
    numIterCols = startCol;

    /* Fill in iterator information for the parser*/
    histData.numIterCols = numIterCols;
    histData.iterCols = iterCols;
    histData.parsers = parsers;
    histData.infos = infos;
    histData.repeat = repeat;

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.hcolnum[0]  = colnum[0];
    histData.amin1 = tmin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = tbin[0];
    histData.haxis1 = (long) taxes[0];
    histData.incr[0] = 1;

    if (histData.haxis > 1)
    {
      histData.hcolnum[1]  = colnum[1];
      histData.amin2 = tmin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = tbin[1];
      histData.haxis2 = (long) taxes[1];
      histData.incr[1] = histData.incr[0] * histData.haxis1;

      if (histData.haxis > 2)
      {
        histData.hcolnum[2]  = colnum[2];
        histData.amin3 = tmin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = tbin[2];
        histData.haxis3 = (long) taxes[2];
	histData.incr[2] = histData.incr[1] * histData.haxis2;

        if (histData.haxis > 3)
        {
          histData.hcolnum[3]  = colnum[3];
          histData.amin4 = tmin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = tbin[3];
          histData.haxis4 = (long) taxes[3];
	  histData.incr[3] = histData.incr[2] * histData.haxis3;
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status);
       
 cleanup:
    /* Free any allocated memory ... */
    if (iterCols) free(iterCols);
    /* ... and parsers */
    for (ii = 0; ii <= 4; ii ++) {
      if (parsers[ii].nCols > 0) ffcprs(&(parsers[ii]));
    }
    return(*status);
}